

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.h
# Opt level: O2

void __thiscall pbrt::TriangleMesh::TriangleMesh(TriangleMesh *this,SP *material)

{
  __shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::__shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_20,&material->super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>);
  Shape::Shape(&this->super_Shape,(SP *)&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  (this->super_Shape).super_Entity._vptr_Entity = (_func_int **)&PTR_toString_abi_cxx11__00167c30;
  memset(&this->vertex,0,0x89);
  (this->bounds).lower.x = 3.4028235e+38;
  (this->bounds).lower.y = 3.4028235e+38;
  *(undefined8 *)&(this->bounds).lower.z = 0xff7fffff7f7fffff;
  (this->bounds).upper.y = -3.4028235e+38;
  (this->bounds).upper.z = -3.4028235e+38;
  return;
}

Assistant:

TriangleMesh(Material::SP material=Material::SP()) : Shape(material) {}